

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx2.cpp
# Opt level: O2

int __thiscall ncnn::InnerProduct_x86_avx2::create_pipeline(InnerProduct_x86_avx2 *this,Option *opt)

{
  uint _h;
  int iVar1;
  int iVar2;
  _func_int *p_Var3;
  _func_int **pp_Var4;
  void *pvVar5;
  size_t sVar6;
  uint _elempack;
  Layer *pLVar7;
  undefined4 *puVar8;
  _func_int **pp_Var9;
  ulong uVar10;
  _func_int **pp_Var11;
  ulong uVar12;
  ulong uVar13;
  int _w;
  ulong uVar14;
  bool bVar15;
  ParamDict pd;
  size_t local_68;
  int local_4c;
  
  pLVar7 = create_layer(0xe);
  this->flatten = pLVar7;
  ParamDict::ParamDict(&pd);
  (*this->flatten->_vptr_Layer[2])(this->flatten,&pd);
  (*this->flatten->_vptr_Layer[4])(this->flatten,opt);
  ParamDict::~ParamDict(&pd);
  p_Var3 = this->_vptr_InnerProduct_x86_avx2[-3];
  if ((opt->use_int8_inference == true) && (*(long *)(&this->field_0x140 + (long)p_Var3) == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  _h = *(uint *)(p_Var3 + 0x28 + (long)&(this->weight_data_int8).data);
  iVar1 = *(int *)(p_Var3 + 0x30 + (long)&(this->weight_data_int8).data);
  if (opt->use_packing_layout == true) {
    if ((_h & 7) == 0) {
      _elempack = 8;
    }
    else {
      if ((_h & 3) != 0) goto LAB_001b9472;
      _elempack = 4;
    }
    uVar13 = 0;
    _w = (int)((long)iVar1 / (long)(int)_h);
    Mat::reshape((Mat *)&pd,(Mat *)(p_Var3 + 0x40 + (long)&(this->scales_in).data),_w,_h,
                 (Allocator *)0x0);
    Mat::create(&this->weight_data_packed,_w,
                *(int *)(this->_vptr_InnerProduct_x86_avx2[-3] + 0x28 +
                        (long)&(this->weight_data_int8).data) / (int)_elempack,
                (ulong)(_elempack * 4),_elempack,(Allocator *)0x0);
    pp_Var4 = this->_vptr_InnerProduct_x86_avx2;
    pvVar5 = (this->weight_data_packed).data;
    iVar2 = (this->weight_data_packed).w;
    sVar6 = (this->weight_data_packed).elemsize;
    uVar14 = (long)iVar1 / (long)(int)_h & 0xffffffff;
    if (_w < 1) {
      uVar14 = uVar13;
    }
    for (; (long)((_elempack - 1) + uVar13) <
           (long)*(int *)(pp_Var4[-3] + 0x28 + (long)&(this->weight_data_int8).data);
        uVar13 = uVar13 + _elempack) {
      puVar8 = (undefined4 *)
               (((uVar13 & 0xffffffff) / (ulong)_elempack) * (long)iVar2 * sVar6 + (long)pvVar5);
      pp_Var11 = (_func_int **)((long)local_4c * local_68 * uVar13 + (long)pd._vptr_ParamDict);
      for (uVar12 = 0; pp_Var9 = pp_Var11, uVar10 = (ulong)_elempack, uVar12 != uVar14;
          uVar12 = uVar12 + 1) {
        while (bVar15 = uVar10 != 0, uVar10 = uVar10 - 1, bVar15) {
          *puVar8 = *(undefined4 *)pp_Var9;
          puVar8 = puVar8 + 1;
          pp_Var9 = (_func_int **)((long)pp_Var9 + (long)local_4c * local_68);
        }
        pp_Var11 = (_func_int **)((long)pp_Var11 + 4);
      }
    }
    Mat::~Mat((Mat *)&pd);
  }
LAB_001b9472:
  if ((opt->use_weight_fp16_storage == true) &&
     (*(long *)(&this->field_0x140 + (long)this->_vptr_InnerProduct_x86_avx2[-3]) == 4)) {
    cast_float32_to_float16
              ((Mat *)(this->_vptr_InnerProduct_x86_avx2[-3] + 0x40 + (long)&(this->scales_in).data)
               ,&this->weight_data_fp16,opt);
  }
  return 0;
}

Assistant:

int InnerProduct_x86_avx2::create_pipeline(const Option& opt)
{
    //     if (opt.use_packing_layout)
    {
        flatten = ncnn::create_layer(ncnn::LayerType::Flatten);

        ncnn::ParamDict pd;

        flatten->load_param(pd);

        flatten->create_pipeline(opt);
    }

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (out_elempack != 1)
    {
        // src = inch-outch
        // dst = pb-inch-outch/pb
        {
            Mat weight_data_r2 = weight_data.reshape(num_input, num_output);

            weight_data_packed.create(num_input, num_output / out_elempack, (size_t)4u * out_elempack, out_elempack);

            for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
            {
                float* g0 = weight_data_packed.row(q / out_elempack);

                for (int p = 0; p < num_input; p++)
                {
                    for (int j = 0; j < out_elempack; j++)
                    {
                        *g0++ = weight_data_r2.row(q + j)[p];
                    }
                }
            }
        }
    }

#if __AVX2__
    if (opt.use_weight_fp16_storage && weight_data.elemsize == 4u)
    {
        ncnn::cast_float32_to_float16(weight_data, weight_data_fp16, opt);

        return 0;
    }
#endif

    return 0;
}